

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O1

void ncnn::pack_A_tile_int8_avxvnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  undefined1 (*pauVar13) [32];
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  int iVar21;
  uint uVar22;
  char *pcVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar32 [16];
  undefined1 in_ZMM7 [64];
  
  auVar32 = in_ZMM7._0_16_;
  iVar12 = cpu_support_x86_avx_vnni_int8();
  auVar10 = _DAT_00600ce0;
  if (iVar12 != 0) {
    pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  pauVar13 = (undefined1 (*) [32])AT->data;
  uVar19 = 0;
  lVar27 = (long)k;
  lVar26 = (long)i;
  if (7 < max_ii) {
    auVar11 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar28._8_4_ = 0xc080400;
    auVar28._0_8_ = 0xc0804000c080400;
    auVar28._12_4_ = 0xc080400;
    auVar28._16_4_ = 0xc080400;
    auVar28._20_4_ = 0xc080400;
    auVar28._24_4_ = 0xc080400;
    auVar28._28_4_ = 0xc080400;
    uVar16 = 0;
    do {
      iVar12 = A->w;
      auVar31._4_4_ = iVar12;
      auVar31._0_4_ = iVar12;
      auVar31._8_4_ = iVar12;
      auVar31._12_4_ = iVar12;
      auVar31._16_4_ = iVar12;
      auVar31._20_4_ = iVar12;
      auVar31._24_4_ = iVar12;
      auVar31._28_4_ = iVar12;
      vpmulld_avx2(auVar31,auVar11);
      auVar30 = ZEXT1664((undefined1  [16])0x0);
      if (3 < max_kk) {
        auVar10 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
        vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar10);
        halt_baddata();
      }
      iVar12 = 0;
      if (3 < max_kk) {
        *pauVar13 = auVar30._0_32_;
        pauVar13 = pauVar13 + 1;
      }
      iVar25 = iVar12;
      if (1 < max_kk) {
        do {
          auVar31 = vpcmpeqd_avx2(auVar30._0_32_,auVar30._0_32_);
          auVar31 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar31);
          in_ZMM6 = ZEXT3264(auVar31);
          auVar31 = vpshufb_avx2(auVar31,auVar10);
          auVar31 = vpermq_avx2(auVar31,0xe8);
          auVar30 = ZEXT3264(auVar31);
          *(undefined1 (*) [16])*pauVar13 = auVar31._0_16_;
          pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 0x10);
          iVar12 = iVar25 + 2;
          iVar21 = iVar25 + 3;
          iVar25 = iVar12;
        } while (iVar21 < max_kk);
      }
      iVar25 = max_kk - iVar12;
      if (iVar25 != 0 && iVar12 <= max_kk) {
        do {
          auVar31 = vpcmpeqd_avx2(auVar30._0_32_,auVar30._0_32_);
          auVar31 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar31);
          auVar31 = vpshufb_avx2(auVar31,auVar28);
          in_ZMM6 = ZEXT1664(auVar31._16_16_);
          auVar9 = vpunpckldq_avx(auVar31._0_16_,auVar31._16_16_);
          auVar30 = ZEXT1664(auVar9);
          *(long *)*pauVar13 = auVar9._0_8_;
          pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 8);
          iVar25 = iVar25 + -1;
        } while (iVar25 != 0);
      }
      uVar19 = uVar16 + 8;
      uVar17 = uVar16 + 0xf;
      uVar16 = uVar19;
    } while (uVar17 < (uint)max_ii);
  }
  lVar15 = (long)max_ii;
  if ((int)((uint)uVar19 | 3) < max_ii) {
    auVar9 = vpmovsxbd_avx(ZEXT416(0x3020100));
    uVar16 = uVar19 & 0xffffffff;
    do {
      iVar12 = A->w;
      iVar25 = 0;
      auVar29._4_4_ = iVar12;
      auVar29._0_4_ = iVar12;
      auVar29._8_4_ = iVar12;
      auVar29._12_4_ = iVar12;
      vpmulld_avx(auVar29,auVar9);
      if (3 < max_kk) {
        auVar32 = vpcmpeqd_avx(auVar32,auVar32);
        vpgatherdd((undefined1  [16])0x0,auVar32);
        halt_baddata();
      }
      if (3 < max_kk) {
        *(undefined1 (*) [16])*pauVar13 = (undefined1  [16])0x0;
        pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 0x10);
      }
      iVar12 = iVar25;
      if (1 < max_kk) {
        do {
          auVar29 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
          auVar29 = vpgatherdd((undefined1  [16])0x0,auVar29);
          in_ZMM6 = ZEXT1664((undefined1  [16])0x0);
          auVar29 = vpshufb_avx(auVar29,ZEXT816(0xd0c090805040100));
          *(long *)*pauVar13 = auVar29._0_8_;
          pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 8);
          iVar25 = iVar12 + 2;
          iVar21 = iVar12 + 3;
          iVar12 = iVar25;
        } while (iVar21 < max_kk);
      }
      iVar12 = max_kk - iVar25;
      if (iVar12 != 0 && iVar25 <= max_kk) {
        do {
          auVar29 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
          auVar29 = vpgatherdd((undefined1  [16])0x0,auVar29);
          in_ZMM6 = ZEXT1664((undefined1  [16])0x0);
          auVar29 = vpshufb_avx(auVar29,SUB6416(ZEXT464(0xc080400),0));
          *(int *)*pauVar13 = auVar29._0_4_;
          pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 4);
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      uVar19 = uVar16 + 4;
      lVar18 = uVar16 + 7;
      uVar16 = uVar19;
    } while (lVar18 < lVar15);
  }
  if ((int)((uint)uVar19 | 1) < max_ii) {
    uVar16 = uVar19 & 0xffffffff;
    do {
      lVar18 = (long)A->w * A->elemsize;
      pcVar20 = (char *)((long)A->data + (uVar16 + lVar26) * lVar18 + lVar27);
      pcVar23 = (char *)((long)A->data + (uVar16 + lVar26 + 1) * lVar18 + lVar27);
      if (max_kk < 4) {
        uVar22 = 0;
        iVar12 = 0;
        iVar25 = 0;
      }
      else {
        iVar25 = 0;
        iVar21 = 3;
        iVar12 = 0;
        do {
          cVar1 = *pcVar20;
          (*pauVar13)[0] = cVar1;
          cVar2 = pcVar20[1];
          *(char *)((long)*pauVar13 + 1) = cVar2;
          cVar3 = pcVar20[2];
          *(char *)((long)*pauVar13 + 2) = cVar3;
          cVar4 = pcVar20[3];
          *(char *)((long)*pauVar13 + 3) = cVar4;
          cVar5 = *pcVar23;
          *(char *)((long)*pauVar13 + 4) = cVar5;
          cVar6 = pcVar23[1];
          *(char *)((long)*pauVar13 + 5) = cVar6;
          cVar7 = pcVar23[2];
          *(char *)((long)*pauVar13 + 6) = cVar7;
          cVar8 = pcVar23[3];
          *(char *)((long)*pauVar13 + 7) = cVar8;
          iVar12 = iVar12 + cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          iVar25 = iVar25 + cVar5 + (int)cVar6 + (int)cVar7 + (int)cVar8;
          pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 8);
          pcVar20 = pcVar20 + 4;
          pcVar23 = pcVar23 + 4;
          iVar21 = iVar21 + 4;
        } while (iVar21 < max_kk);
        iVar12 = iVar12 * 0x7f;
        iVar25 = iVar25 * 0x7f;
        uVar22 = max_kk & 0xfffffffc;
      }
      if (3 < max_kk) {
        *(int *)*pauVar13 = iVar12;
        *(int *)((long)*pauVar13 + 4) = iVar25;
        pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 8);
      }
      uVar14 = uVar22 | 1;
      while ((int)uVar14 < max_kk) {
        (*pauVar13)[0] = *pcVar20;
        *(char *)((long)*pauVar13 + 1) = pcVar20[1];
        *(char *)((long)*pauVar13 + 2) = *pcVar23;
        *(char *)((long)*pauVar13 + 3) = pcVar23[1];
        pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 4);
        pcVar20 = pcVar20 + 2;
        pcVar23 = pcVar23 + 2;
        uVar14 = uVar22 + 3;
        uVar22 = uVar22 + 2;
      }
      if ((int)uVar22 < max_kk) {
        lVar18 = 0;
        do {
          (*pauVar13)[0] = pcVar20[lVar18];
          *(char *)((long)*pauVar13 + 1) = pcVar23[lVar18];
          pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 2);
          lVar18 = lVar18 + 1;
        } while (max_kk - uVar22 != (int)lVar18);
      }
      uVar19 = uVar16 + 2;
      lVar18 = uVar16 + 3;
      uVar16 = uVar19;
    } while (lVar18 < lVar15);
  }
  if ((int)uVar19 < max_ii) {
    lVar18 = (long)(int)uVar19;
    do {
      pcVar20 = (char *)((long)A->data + lVar27 + (long)A->w * (lVar18 + lVar26) * A->elemsize);
      uVar22 = 0;
      if (max_kk < 4) {
        iVar12 = 0;
      }
      else {
        iVar12 = 3;
        do {
          cVar1 = *pcVar20;
          (*pauVar13)[0] = cVar1;
          cVar2 = pcVar20[1];
          *(char *)((long)*pauVar13 + 1) = cVar2;
          cVar3 = pcVar20[2];
          *(char *)((long)*pauVar13 + 2) = cVar3;
          cVar4 = pcVar20[3];
          *(char *)((long)*pauVar13 + 3) = cVar4;
          uVar22 = uVar22 + (int)cVar1 + (int)cVar2 + (int)cVar3 + (int)cVar4;
          pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 4);
          pcVar20 = pcVar20 + 4;
          iVar12 = iVar12 + 4;
        } while (iVar12 < max_kk);
        iVar12 = uVar22 * 0x7f;
        uVar22 = max_kk & 0xfffffffc;
      }
      if (3 < max_kk) {
        *(int *)*pauVar13 = iVar12;
        pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + 4);
      }
      if ((int)uVar22 < max_kk) {
        lVar24 = 0;
        do {
          *(char *)((long)*pauVar13 + lVar24) = pcVar20[lVar24];
          lVar24 = lVar24 + 1;
        } while (max_kk - uVar22 != (int)lVar24);
        pauVar13 = (undefined1 (*) [32])((long)*pauVar13 + lVar24);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar15);
  }
  return;
}

Assistant:

void pack_A_tile_int8_avxvnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}